

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistanceGraph.cc
# Opt level: O1

vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> * __thiscall
DistanceGraph::find_bubbles
          (vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
           *__return_storage_ptr__,DistanceGraph *this,uint32_t min_size,uint32_t max_size)

{
  long lVar1;
  void *pvVar2;
  pointer pNVar3;
  ulong uVar4;
  pointer pLVar5;
  vector<bool,_std::allocator<bool>_> used;
  vector<Link,_std::allocator<Link>_> fwl;
  sgNodeID_t n2;
  vector<Link,_std::allocator<Link>_> parln;
  vector<Link,_std::allocator<Link>_> bwl;
  vector<Link,_std::allocator<Link>_> parlp;
  ulong local_d8;
  vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *local_d0;
  vector<bool,_std::allocator<bool>_> local_c8;
  vector<Link,_std::allocator<Link>_> local_a0;
  ulong local_88;
  ulong local_80;
  vector<Link,_std::allocator<Link>_> local_78;
  vector<Link,_std::allocator<Link>_> local_60;
  vector<Link,_std::allocator<Link>_> local_48;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a0.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.super__Vector_impl_data._M_start.
  _0_1_ = 0;
  local_d0 = (vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *)
             __return_storage_ptr__;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_c8,
             ((long)(this->sdg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->sdg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7,(bool *)&local_a0,
             (allocator_type *)&local_60);
  local_d8 = 1;
  pNVar3 = (this->sdg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (1 < (ulong)(((long)(this->sdg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)pNVar3 >> 3) * 0x6db6db6db6db6db7
                 )) {
    local_88 = (ulong)min_size;
    do {
      uVar4 = local_d8 + 0x3f;
      if (-1 < (long)local_d8) {
        uVar4 = local_d8;
      }
      if (((local_c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p
            [((long)uVar4 >> 6) +
             ((ulong)((local_d8 & 0x800000000000003f) < 0x8000000000000001) - 1)] >>
            (local_d8 & 0x3f) & 1) == 0) &&
         (uVar4 = pNVar3[local_d8].sequence._M_string_length, uVar4 <= max_size && local_88 <= uVar4
         )) {
        get_fw_links(&local_a0,this,local_d8);
        if ((long)local_a0.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            CONCAT71(local_a0.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                     super__Vector_impl_data._M_start._1_7_,
                     local_a0.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                     super__Vector_impl_data._M_start._0_1_) == 0x28) {
          get_fw_links(&local_60,this,-local_d8);
          if ((long)local_60.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_60.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                    super__Vector_impl_data._M_start == 0x28) {
            lVar1 = (local_60.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                     super__Vector_impl_data._M_start)->dest;
            get_fw_links(&local_78,this,
                         -*(long *)(CONCAT71(local_a0.
                                             super__Vector_base<Link,_std::allocator<Link>_>._M_impl
                                             .super__Vector_impl_data._M_start._1_7_,
                                             local_a0.
                                             super__Vector_base<Link,_std::allocator<Link>_>._M_impl
                                             .super__Vector_impl_data._M_start._0_1_) + 8));
            if ((long)local_78.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_78.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                      super__Vector_impl_data._M_start == 0x50) {
              get_fw_links(&local_48,this,-lVar1);
              if ((long)local_48.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_48.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                        super__Vector_impl_data._M_start == 0x50) {
                pLVar5 = local_48.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                         super__Vector_impl_data._M_start + 1;
                if ((local_48.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                     super__Vector_impl_data._M_start)->dest != local_d8) {
                  pLVar5 = local_48.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                           super__Vector_impl_data._M_start;
                }
                local_80 = pLVar5->dest;
                if (((local_78.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                      super__Vector_impl_data._M_start)->dest + local_80 == 0) ||
                   (local_78.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                    super__Vector_impl_data._M_start[1].dest + local_80 == 0)) {
                  uVar4 = -local_80;
                  if (0 < (long)local_80) {
                    uVar4 = local_80;
                  }
                  uVar4 = (this->sdg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl
                          .super__Vector_impl_data._M_start[uVar4].sequence._M_string_length;
                  if (uVar4 <= max_size && local_88 <= uVar4) {
                    uVar4 = local_d8 + 0x3f;
                    if (-1 < (long)local_d8) {
                      uVar4 = local_d8;
                    }
                    local_c8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                    [((long)uVar4 >> 6) +
                     ((ulong)((local_d8 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
                         local_c8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                         [((long)uVar4 >> 6) +
                          ((ulong)((local_d8 & 0x800000000000003f) < 0x8000000000000001) - 1)] |
                         1L << ((byte)local_d8 & 0x3f);
                    uVar4 = -local_80;
                    if (0 < (long)local_80) {
                      uVar4 = local_80;
                    }
                    local_c8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar4 >> 6] =
                         local_c8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar4 >> 6]
                         | 1L << ((byte)uVar4 & 0x3f);
                    std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::
                    emplace_back<long&,long&>(local_d0,(long *)&local_d8,(long *)&local_80);
                  }
                }
              }
              if (local_48.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_48.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)local_48.super__Vector_base<Link,_std::allocator<Link>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_48.super__Vector_base<Link,_std::allocator<Link>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
              }
            }
            if (local_78.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_78.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_78.super__Vector_base<Link,_std::allocator<Link>_>._M_impl
                                    .super__Vector_impl_data._M_end_of_storage -
                              (long)local_78.super__Vector_base<Link,_std::allocator<Link>_>._M_impl
                                    .super__Vector_impl_data._M_start);
            }
          }
          if (local_60.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_60.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_60.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_60.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
        }
        pvVar2 = (void *)CONCAT71(local_a0.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                                  super__Vector_impl_data._M_start._1_7_,
                                  local_a0.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                                  super__Vector_impl_data._M_start._0_1_);
        if (pvVar2 != (void *)0x0) {
          operator_delete(pvVar2,(long)local_a0.super__Vector_base<Link,_std::allocator<Link>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)pvVar2);
        }
      }
      local_d8 = local_d8 + 1;
      pNVar3 = (this->sdg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (local_d8 <
             (ulong)(((long)(this->sdg->nodes).super__Vector_base<Node,_std::allocator<Node>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)pNVar3 >> 3) *
                    0x6db6db6db6db6db7));
  }
  if (local_c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_c8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_c8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_c8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return (vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)local_d0;
}

Assistant:

std::vector<std::pair<sgNodeID_t,sgNodeID_t>> DistanceGraph::find_bubbles(uint32_t min_size,uint32_t max_size) const {
    std::vector<std::pair<sgNodeID_t,sgNodeID_t>> r;
    std::vector<bool> used(sdg.nodes.size(),false);
    sgNodeID_t n1,n2;
    size_t s1,s2;
    for (n1=1;n1<sdg.nodes.size();++n1){
        if (used[n1]) continue;
        //get "topologically correct" bubble: prev -> [n1 | n2] -> next
        s1=sdg.nodes[n1].sequence.size();
        if (s1<min_size or s1>max_size) continue;

        auto fwl=get_fw_links(n1);
        if (fwl.size()!=1) continue;
        auto bwl=get_bw_links(n1);
        if (bwl.size()!=1) continue;
        auto next=fwl[0].dest;
        auto prev=bwl[0].dest;
        auto parln=get_bw_links(next);
        if (parln.size()!=2) continue;
        auto parlp=get_fw_links(-prev);
        if (parlp.size()!=2) continue;

        if (parlp[0].dest!=n1) n2=parlp[0].dest;
        else n2=parlp[1].dest;

        if (n2!=-parln[0].dest and n2!=-parln[1].dest) continue;
        s2=sdg.nodes[llabs(n2)].sequence.size();
        if (s2<min_size or s2>max_size) continue;

        used[n1]=true;
        used[llabs(n2)]=true;
        r.emplace_back(n1,n2);

    }
    return r;
}